

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

Expression * __thiscall rsg::TexLookup::createNextChild(TexLookup *this,GeneratorState *state)

{
  Type TVar1;
  ValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ValueRangeAccess valueRange_02;
  ConstValueRangeAccess valueRange_03;
  bool bVar2;
  deUint32 dVar3;
  Expression *pEVar4;
  uint compNdx;
  int ndx;
  uint compNdx_00;
  int iVar5;
  StridedValueAccess<1> SVar6;
  ValueRange lodRange;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  int local_d0;
  VariableType *local_c8;
  pointer pMStack_c0;
  pointer local_b8;
  pointer pMStack_b0;
  ValueRange *local_a8;
  Scalar *pSStack_a0;
  Scalar *local_98;
  ValueRange *local_90;
  Scalar *pSStack_88;
  Scalar *local_80;
  ValueRange *local_78;
  Scalar *pSStack_70;
  Scalar *local_68;
  ValueRange *local_60;
  Scalar *pSStack_58;
  Scalar *local_50;
  ValueRange *local_48;
  Scalar *pSStack_40;
  Scalar *local_38;
  
  TVar1 = this->m_type;
  if (((TVar1 < TYPE_LAST) && ((0x2aU >> (TVar1 & 0x1f) & 1) != 0)) &&
     (this->m_lodBiasExpr == (Expression *)0x0)) {
    local_f8._8_8_ = &local_e0;
    local_f8._0_8_ = &DAT_00000001;
    local_f8._16_8_ = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0 = 1;
    local_c8 = (VariableType *)0x0;
    pMStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    pMStack_b0 = (pointer)0x0;
    ValueRange::ValueRange(&lodRange,(VariableType *)local_f8);
    VariableType::~VariableType((VariableType *)local_f8);
    pSStack_40 = lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_40 = (Scalar *)0x0;
    }
    local_38 = lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_38 = (Scalar *)0x0;
    }
    valueRange.super_ConstValueRangeAccess.m_min = pSStack_40;
    valueRange.super_ConstValueRangeAccess.m_type = &lodRange.m_type;
    valueRange.super_ConstValueRangeAccess.m_max = local_38;
    local_48 = &lodRange;
    rsg::anon_unknown_0::setInfiniteRange(valueRange);
    pSStack_58 = lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_58 = (Scalar *)0x0;
    }
    local_50 = lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_50 = (Scalar *)0x0;
    }
    valueRange_00.m_min = pSStack_58;
    valueRange_00.m_type = &lodRange.m_type;
    valueRange_00.m_max = local_50;
    local_60 = &lodRange;
    pEVar4 = Expression::createRandom(state,valueRange_00);
    this->m_lodBiasExpr = pEVar4;
    ValueRange::~ValueRange(&lodRange);
    return pEVar4;
  }
  if (this->m_coordExpr != (Expression *)0x0) {
    return (Expression *)0x0;
  }
  if (TVar1 - TYPE_TEXTURE2D_PROJ < 2) {
    local_d0 = 3;
    bVar2 = true;
  }
  else {
    if (TVar1 - TYPE_TEXTURECUBE < 2) {
      dVar3 = deRandom_getUint32(&state->m_random->m_rnd);
      compNdx = dVar3 % 3;
      local_f8._8_8_ = &local_e0;
      local_f8._0_8_ = &DAT_00000001;
      local_f8._16_8_ = 0;
      local_e0._M_local_buf[0] = '\0';
      local_d0 = 3;
      local_c8 = (VariableType *)0x0;
      pMStack_c0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      pMStack_b0 = (pointer)0x0;
      ValueRange::ValueRange(&lodRange,(VariableType *)local_f8);
      VariableType::~VariableType((VariableType *)local_f8);
      for (compNdx_00 = 0; compNdx_00 != 3; compNdx_00 = compNdx_00 + 1) {
        if (compNdx == compNdx_00) {
          bVar2 = de::Random::getBool(state->m_random);
          local_f8._8_8_ = (pointer)0x0;
          if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start !=
              lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_f8._8_8_ =
                 lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          local_f8._0_8_ = &lodRange;
          SVar6 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_f8,compNdx);
          iVar5 = -0x3f800000;
          if (!bVar2) {
            iVar5 = 0x40100000;
          }
          (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = iVar5;
          local_f8._8_8_ = (pointer)0x0;
          if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start !=
              lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_f8._8_8_ =
                 lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          local_f8._0_8_ = &lodRange;
          SVar6 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_f8,compNdx);
          iVar5 = -0x3ff00000;
          if (!bVar2) {
            iVar5 = 0x40800000;
          }
          (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = iVar5;
        }
        else {
          local_f8._8_8_ = (pointer)0x0;
          if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start !=
              lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_f8._8_8_ =
                 lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          local_f8._0_8_ = &lodRange;
          SVar6 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_f8,compNdx_00);
          (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = -0x40000000;
          local_f8._8_8_ = (pointer)0x0;
          if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_start !=
              lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_f8._8_8_ =
                 lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          local_f8._0_8_ = &lodRange;
          SVar6 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_f8,compNdx_00);
          (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = 0x40000000;
        }
      }
      pSStack_70 = lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSStack_70 = (Scalar *)0x0;
      }
      local_68 = lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_68 = (Scalar *)0x0;
      }
      valueRange_01.m_min = pSStack_70;
      valueRange_01.m_type = &lodRange.m_type;
      valueRange_01.m_max = local_68;
      local_78 = &lodRange;
      pEVar4 = Expression::createRandom(state,valueRange_01);
      goto LAB_015e1182;
    }
    local_d0 = 2;
    bVar2 = false;
  }
  local_f8._8_8_ = &local_e0;
  local_f8._0_8_ = &DAT_00000001;
  local_f8._16_8_ = 0;
  local_e0._M_local_buf[0] = '\0';
  local_c8 = (VariableType *)0x0;
  pMStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  pMStack_b0 = (pointer)0x0;
  ValueRange::ValueRange(&lodRange,(VariableType *)local_f8);
  VariableType::~VariableType((VariableType *)local_f8);
  pSStack_88 = lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSStack_88 = (Scalar *)0x0;
  }
  local_80 = lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_80 = (Scalar *)0x0;
  }
  valueRange_02.super_ConstValueRangeAccess.m_min = pSStack_88;
  valueRange_02.super_ConstValueRangeAccess.m_type = &lodRange.m_type;
  valueRange_02.super_ConstValueRangeAccess.m_max = local_80;
  local_90 = &lodRange;
  rsg::anon_unknown_0::setInfiniteRange(valueRange_02);
  if (bVar2) {
    bVar2 = de::Random::getBool(state->m_random);
    local_f8._8_8_ = (pointer)0x0;
    if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start !=
        lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_f8._8_8_ =
           lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_f8._0_8_ = &lodRange;
    SVar6 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_f8,2);
    if (bVar2) {
      iVar5 = -0x3f800000;
    }
    else {
      iVar5 = 0x3e800000;
    }
    (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = iVar5;
    local_f8._8_8_ = (pointer)0x0;
    if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start !=
        lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_f8._8_8_ =
           lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_f8._0_8_ = &lodRange;
    SVar6 = StridedValueAccess<1>::component((StridedValueAccess<1> *)local_f8,2);
    if (bVar2) {
      iVar5 = -0x41800000;
    }
    else {
      iVar5 = 0x40800000;
    }
    (SVar6.super_ConstStridedValueAccess<1>.m_value)->intVal = iVar5;
  }
  pSStack_a0 = lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      lodRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSStack_a0 = (Scalar *)0x0;
  }
  local_98 = lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start ==
      lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_98 = (Scalar *)0x0;
  }
  valueRange_03.m_min = pSStack_a0;
  valueRange_03.m_type = &lodRange.m_type;
  valueRange_03.m_max = local_98;
  local_a8 = &lodRange;
  pEVar4 = Expression::createRandom(state,valueRange_03);
LAB_015e1182:
  this->m_coordExpr = pEVar4;
  ValueRange::~ValueRange(&lodRange);
  return this->m_coordExpr;
}

Assistant:

Expression* TexLookup::createNextChild (GeneratorState& state)
{
	bool hasLodBias		= m_type == TYPE_TEXTURE2D_LOD ||
						  m_type == TYPE_TEXTURE2D_PROJ_LOD ||
						  m_type == TYPE_TEXTURECUBE_LOD;

	if (hasLodBias && !m_lodBiasExpr)
	{
		ValueRange lodRange(VariableType(VariableType::TYPE_FLOAT, 1));
		setInfiniteRange(lodRange); // Any value is valid.

		m_lodBiasExpr = Expression::createRandom(state, lodRange.asAccess());
		return m_lodBiasExpr;
	}

	if (!m_coordExpr)
	{
		if (m_type == TYPE_TEXTURECUBE || m_type == TYPE_TEXTURECUBE_LOD)
		{
			// Make sure major axis selection can be done.
			int majorAxisNdx = state.getRandom().getInt(0, 2);

			ValueRange coordRange(VariableType(VariableType::TYPE_FLOAT, 3));

			for (int ndx = 0; ndx < 3; ndx++)
			{
				if (ndx == majorAxisNdx)
				{
					bool neg = state.getRandom().getBool();
					coordRange.getMin().component(ndx) = neg ? -4.0f	: 2.25f;
					coordRange.getMax().component(ndx) = neg ? -2.25f	: 4.0f;
				}
				else
				{
					coordRange.getMin().component(ndx) = -2.0f;
					coordRange.getMax().component(ndx) =  2.0f;
				}
			}

			m_coordExpr = Expression::createRandom(state, coordRange.asAccess());
		}
		else
		{
			bool	isProj				= m_type == TYPE_TEXTURE2D_PROJ || m_type == TYPE_TEXTURE2D_PROJ_LOD;
			int		coordScalarSize		= isProj ? 3 : 2;

			ValueRange coordRange(VariableType(VariableType::TYPE_FLOAT, coordScalarSize));
			setInfiniteRange(coordRange); // Initialize base range with -inf..inf

			if (isProj)
			{
				// w coordinate must be something sane, and not 0.
				bool neg = state.getRandom().getBool();
				coordRange.getMin().component(2) = neg ? -4.0f  : 0.25f;
				coordRange.getMax().component(2) = neg ? -0.25f : 4.0f;
			}

			m_coordExpr = Expression::createRandom(state, coordRange.asAccess());
		}

		DE_ASSERT(m_coordExpr);
		return m_coordExpr;
	}

	return DE_NULL; // Done.
}